

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O0

void __thiscall matrix::print(matrix *this)

{
  int iVar1;
  size_type sVar2;
  poly *this_00;
  int local_20;
  int local_1c;
  int j;
  int i;
  matrix *B;
  matrix *this_local;
  
  local_1c = 0;
  while( true ) {
    sVar2 = std::__cxx1998::vector<poly,_std::allocator<poly>_>::size
                      (&(this->rows).super_vector<poly,_std::allocator<poly>_>);
    if ((int)sVar2 <= local_1c) break;
    for (local_20 = 0; local_20 < this->ncols; local_20 = local_20 + 1) {
      this_00 = operator[](this,local_1c);
      iVar1 = poly::operator[](this_00,local_20);
      std::ostream::operator<<((ostream *)&std::cout,iVar1);
    }
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

void matrix::print() const {
    const auto &B = *this;
    for (int i = 0; i < static_cast<int>(rows.size()); i++) {
        for (int j = 0; j < ncols; j++)
            std::cout << B[i][j];
        std::cout << std::endl;
    }
}